

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O3

void log_message_chunk(MESSAGE_SENDER_INSTANCE *message_sender,char *name,AMQP_VALUE value)

{
  LOGGER_LOG p_Var1;
  char *__ptr;
  char *pcVar2;
  
  p_Var1 = xlogging_get_log_function();
  if ((p_Var1 != (LOGGER_LOG)0x0) && ((message_sender->field_0x30 & 1) != 0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar2 = "NULL";
      if (name != (char *)0x0) {
        pcVar2 = name;
      }
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                ,"log_message_chunk",0xbd,0,"%s",pcVar2);
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      __ptr = amqpvalue_to_string(value);
      pcVar2 = "NULL";
      if (__ptr != (char *)0x0) {
        pcVar2 = __ptr;
      }
      (*p_Var1)(AZ_LOG_TRACE,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                ,"log_message_chunk",0xbe,0,"%s",pcVar2);
      if (__ptr != (char *)0x0) {
        free(__ptr);
        return;
      }
    }
  }
  return;
}

Assistant:

static void log_message_chunk(MESSAGE_SENDER_INSTANCE* message_sender, const char* name, AMQP_VALUE value)
{
#ifdef NO_LOGGING
    (void)message_sender;
    (void)name;
    (void)value;
#else
    if (xlogging_get_log_function() != NULL && message_sender->is_trace_on == 1)
    {
        char* value_as_string = NULL;
        LOG(AZ_LOG_TRACE, 0, "%s", MU_P_OR_NULL(name));
        LOG(AZ_LOG_TRACE, 0, "%s", ((value_as_string = amqpvalue_to_string(value)), MU_P_OR_NULL(value_as_string)));
        if (value_as_string != NULL)
        {
            free(value_as_string);
        }
    }
#endif
}